

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O0

void Qentem::Test::TestTrim(QTest *test)

{
  uint local_138 [74];
  SizeT length;
  SizeT offset;
  QTest *test_local;
  
  local_138[0x49] = 0;
  local_138[0x48] = 0;
  _length = test;
  StringUtils::Trim<char,unsigned_int>("",local_138 + 0x49,local_138 + 0x48);
  local_138[0x47] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x47,0x1ca);
  local_138[0x46] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x46,0x1cb);
  local_138[0x49] = 0;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>(" ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x45] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x45,0x1d0);
  local_138[0x44] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x44,0x1d1);
  local_138[0x49] = 0;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>("  ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x43] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x43,0x1d6);
  local_138[0x42] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x42,0x1d7);
  local_138[0x49] = 0;
  local_138[0x48] = 2;
  StringUtils::Trim<char,unsigned_int>("  ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x41] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x41,0x1dc);
  local_138[0x40] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x40,0x1dd);
  local_138[0x49] = 0;
  local_138[0x48] = 2;
  StringUtils::Trim<char,unsigned_int>(" a",local_138 + 0x49,local_138 + 0x48);
  local_138[0x3f] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x3f,0x1e2);
  local_138[0x3e] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x3e,0x1e3);
  local_138[0x49] = 0;
  local_138[0x48] = 4;
  StringUtils::Trim<char,unsigned_int>(" abc",local_138 + 0x49,local_138 + 0x48);
  local_138[0x3d] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x3d,0x1e8);
  local_138[0x3c] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x3c,0x1e9);
  local_138[0x49] = 1;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>(" a",local_138 + 0x49,local_138 + 0x48);
  local_138[0x3b] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x3b,0x1ee);
  local_138[0x3a] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x3a,0x1ef);
  local_138[0x49] = 1;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>(" abc",local_138 + 0x49,local_138 + 0x48);
  local_138[0x39] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x39,500);
  local_138[0x38] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x38,0x1f5);
  local_138[0x49] = 2;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>("  a",local_138 + 0x49,local_138 + 0x48);
  local_138[0x37] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x37,0x1fa);
  local_138[0x36] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x36,0x1fb);
  local_138[0x49] = 2;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>("  abc",local_138 + 0x49,local_138 + 0x48);
  local_138[0x35] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x35,0x200);
  local_138[0x34] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x34,0x201);
  local_138[0x49] = 0;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>("  a",local_138 + 0x49,local_138 + 0x48);
  local_138[0x33] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x33,0x206);
  local_138[0x32] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x32,0x207);
  local_138[0x49] = 0;
  local_138[0x48] = 5;
  StringUtils::Trim<char,unsigned_int>("  abc",local_138 + 0x49,local_138 + 0x48);
  local_138[0x31] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x31,0x20c);
  local_138[0x30] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x30,0x20d);
  local_138[0x49] = 0;
  local_138[0x48] = 4;
  StringUtils::Trim<char,unsigned_int>("   a",local_138 + 0x49,local_138 + 0x48);
  local_138[0x2f] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x2f,0x212);
  local_138[0x2e] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x2e,0x213);
  local_138[0x49] = 0;
  local_138[0x48] = 6;
  StringUtils::Trim<char,unsigned_int>("   abc",local_138 + 0x49,local_138 + 0x48);
  local_138[0x2d] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x2d,0x218);
  local_138[0x2c] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x2c,0x219);
  local_138[0x49] = 0;
  local_138[0x48] = 2;
  StringUtils::Trim<char,unsigned_int>("a ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x2b] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x2b,0x21e);
  local_138[0x2a] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x2a,0x21f);
  local_138[0x49] = 0;
  local_138[0x48] = 4;
  StringUtils::Trim<char,unsigned_int>("abc ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x29] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x29,0x224);
  local_138[0x28] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x28,0x225);
  local_138[0x49] = 0;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>("a ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x27] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x27,0x22a);
  local_138[0x26] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x26,0x22b);
  local_138[0x49] = 0;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>("abc ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x25] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x25,0x230);
  local_138[0x24] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x24,0x231);
  local_138[0x49] = 0;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>("a  ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x23] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x23,0x236);
  local_138[0x22] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x22,0x237);
  local_138[0x49] = 0;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>("abc  ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x21] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x21,0x23c);
  local_138[0x20] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x20,0x23d);
  local_138[0x49] = 0;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>("a  ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x1f] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x1f,0x242);
  local_138[0x1e] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x1e,0x243);
  local_138[0x49] = 0;
  local_138[0x48] = 5;
  StringUtils::Trim<char,unsigned_int>("abc  ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x1d] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x1d,0x248);
  local_138[0x1c] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x1c,0x249);
  local_138[0x49] = 0;
  local_138[0x48] = 4;
  StringUtils::Trim<char,unsigned_int>("a   ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x1b] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x1b,0x24e);
  local_138[0x1a] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x1a,0x24f);
  local_138[0x49] = 0;
  local_138[0x48] = 6;
  StringUtils::Trim<char,unsigned_int>("abc   ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x19] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x19,0x254);
  local_138[0x18] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x18,0x255);
  local_138[0x49] = 0;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>(" a ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x17] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x17,0x25a);
  local_138[0x16] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x16,0x25b);
  local_138[0x49] = 0;
  local_138[0x48] = 5;
  StringUtils::Trim<char,unsigned_int>(" abc ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x15] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x15,0x260);
  local_138[0x14] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x14,0x261);
  local_138[0x49] = 0;
  local_138[0x48] = 5;
  StringUtils::Trim<char,unsigned_int>("  a  ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x13] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x13,0x266);
  local_138[0x12] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x12,0x267);
  local_138[0x49] = 0;
  local_138[0x48] = 7;
  StringUtils::Trim<char,unsigned_int>("  abc  ",local_138 + 0x49,local_138 + 0x48);
  local_138[0x11] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0x11,0x26c);
  local_138[0x10] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0x10,0x26d);
  local_138[0x49] = 0;
  local_138[0x48] = 7;
  StringUtils::Trim<char,unsigned_int>("   a   ",local_138 + 0x49,local_138 + 0x48);
  local_138[0xf] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0xf,0x272);
  local_138[0xe] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0xe,0x273);
  local_138[0x49] = 0;
  local_138[0x48] = 9;
  StringUtils::Trim<char,unsigned_int>("   abc   ",local_138 + 0x49,local_138 + 0x48);
  local_138[0xd] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0xd,0x278);
  local_138[0xc] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 0xc,0x279);
  local_138[0x49] = 1;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>(" a ",local_138 + 0x49,local_138 + 0x48);
  local_138[0xb] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 0xb,0x27e);
  local_138[10] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 10,0x27f);
  local_138[0x49] = 1;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>(" abc ",local_138 + 0x49,local_138 + 0x48);
  local_138[9] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 9,0x284);
  local_138[8] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 8,0x285);
  local_138[0x49] = 2;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>("  a  ",local_138 + 0x49,local_138 + 0x48);
  local_138[7] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 7,0x28a);
  local_138[6] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 6,0x28b);
  local_138[0x49] = 2;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>("  abc  ",local_138 + 0x49,local_138 + 0x48);
  local_138[5] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 5,0x290);
  local_138[4] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 4,0x291);
  local_138[0x49] = 3;
  local_138[0x48] = 1;
  StringUtils::Trim<char,unsigned_int>("   a   ",local_138 + 0x49,local_138 + 0x48);
  local_138[3] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 3,0x296);
  local_138[2] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138 + 2,0x297);
  local_138[0x49] = 3;
  local_138[0x48] = 3;
  StringUtils::Trim<char,unsigned_int>("   abc   ",local_138 + 0x49,local_138 + 0x48);
  local_138[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x49,local_138 + 1,0x29c);
  local_138[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(_length,local_138 + 0x48,local_138,0x29d);
  return;
}

Assistant:

static void TestTrim(QTest &test) {
    SizeT offset = 0;
    SizeT length = 0;

    StringUtils::Trim("", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim(" ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("  ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim("  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim(" a", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim(" abc", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 1;
    length = 1;
    StringUtils::Trim(" a", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 1;
    length = 3;
    StringUtils::Trim(" abc", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 2;
    length = 1;
    StringUtils::Trim("  a", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 2;
    length = 3;
    StringUtils::Trim("  abc", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("  a", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("  abc", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("   a", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 6;
    StringUtils::Trim("   abc", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim("a ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("abc ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("a ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("abc ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("a  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("abc  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("a  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("abc  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("a   ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 6;
    StringUtils::Trim("abc   ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim(" a ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim(" abc ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("  a  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 7;
    StringUtils::Trim("  abc  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 7;
    StringUtils::Trim("   a   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 9;
    StringUtils::Trim("   abc   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 1;
    length = 1;
    StringUtils::Trim(" a ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 1;
    length = 3;
    StringUtils::Trim(" abc ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 2;
    length = 1;
    StringUtils::Trim("  a  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 2;
    length = 3;
    StringUtils::Trim("  abc  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 3;
    length = 1;
    StringUtils::Trim("   a   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 3;
    length = 3;
    StringUtils::Trim("   abc   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);
}